

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::handleUserFunctionCall
          (TGlslangToSpvTraverser *this,TIntermAggregate *node)

{
  Builder *this_00;
  _Base_ptr p_Var1;
  pointer pAVar2;
  Instruction *pIVar3;
  pointer pAVar4;
  _Base_ptr *pp_Var5;
  TIntermAggregate *pTVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Id IVar10;
  Decoration DVar11;
  undefined4 extraout_var;
  mapped_type *ppFVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar14;
  long lVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar18;
  char *filename;
  _Base_ptr p_Var19;
  long lVar20;
  _Base_ptr p_Var21;
  long lVar22;
  mapped_type function;
  vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> argTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rValues;
  vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> lValues;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvArgs;
  Id local_258;
  Id local_254;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_250;
  long local_248;
  mapped_type local_240;
  long local_238;
  _Base_ptr local_230;
  void *local_228;
  long lStack_220;
  long local_218;
  Id *local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_200;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1f8;
  Id local_1ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  TIntermAggregate *local_1c8;
  long local_1c0;
  vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> local_1b8;
  undefined1 local_198 [32];
  Id local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  undefined8 local_158;
  undefined8 uStack_150;
  CoherentFlags local_148 [4];
  Id local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  Id local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined2 local_e8;
  Id local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  Id local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined2 local_90;
  Id local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  
  iVar8 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x35])(node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,*(char **)(CONCAT44(extraout_var,iVar8) + 8),
             (allocator<char> *)&local_1b8);
  ppFVar12 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->functionMap,(key_type *)local_198);
  local_240 = *ppFVar12;
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if (local_240 == (mapped_type)0x0) {
    IVar10 = 0;
  }
  else {
    iVar8 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(node);
    lVar22 = CONCAT44(extraout_var_00,iVar8);
    local_1c8 = node;
    iVar8 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x39])(node);
    local_248 = CONCAT44(extraout_var_01,iVar8);
    local_1b8.
    super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.
    super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_218 = 0;
    local_228 = (void *)0x0;
    lStack_220 = 0;
    lVar14 = *(long *)(lVar22 + 8);
    local_238 = lVar22;
    if (0 < (int)((ulong)(*(long *)(lVar22 + 0x10) - lVar14) >> 3)) {
      local_250 = &(this->builder).accessChain.swizzle;
      lVar22 = 0;
      do {
        lVar20 = local_238;
        plVar13 = (long *)(**(code **)(**(long **)(lVar14 + lVar22 * 8) + 0x18))();
        local_198._0_8_ = (**(code **)(*plVar13 + 0xf0))(plVar13);
        std::vector<glslang::TType_const*,std::allocator<glslang::TType_const*>>::
        emplace_back<glslang::TType_const*>
                  ((vector<glslang::TType_const*,std::allocator<glslang::TType_const*>> *)&local_228
                   ,(TType **)local_198);
        spv::Builder::clearAccessChain(&this->builder);
        plVar13 = *(long **)(*(long *)(lVar20 + 8) + lVar22 * 8);
        (**(code **)(*plVar13 + 0x10))(plVar13,this);
        bVar7 = originalParam(this,*(TStorageQualifier *)(*(long *)(local_248 + 8) + lVar22 * 4),
                              *(TType **)((long)local_228 + lVar22 * 8),
                              (bool)(lVar22 == 0 & local_240->implicitThis));
        if ((bVar7) || (iVar8 = *(int *)(*(long *)(local_248 + 8) + lVar22 * 4), iVar8 - 0x10U < 3))
        {
          local_198._0_4_ = (this->builder).accessChain.base;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_198 + 8),
                     &(this->builder).accessChain.indexChain);
          local_178 = (this->builder).accessChain.instr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_170,local_250);
          local_148[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
          local_158._0_4_ = (this->builder).accessChain.component;
          local_158._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
          uStack_150._0_1_ = (this->builder).accessChain.isRValue;
          uStack_150._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
          uStack_150._4_4_ = (this->builder).accessChain.alignment;
          std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::
          emplace_back<spv::Builder::AccessChain>(&local_1b8,(AccessChain *)local_198);
          if (local_170.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_170.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((uint *)local_198._8_8_ != (uint *)0x0) {
            operator_delete((void *)local_198._8_8_,local_198._24_8_ - local_198._8_8_);
          }
        }
        else {
          if ((iVar8 != 5) && (iVar8 != 0x13)) goto LAB_0044adb8;
          IVar10 = accessChainLoad(this,*(TType **)(lStack_220 + -8));
          local_198._0_4_ = IVar10;
          if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_1e8,
                       (iterator)
                       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_198);
          }
          else {
            *local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = IVar10;
            local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        lVar22 = lVar22 + 1;
        lVar14 = *(long *)(local_238 + 8);
      } while (lVar22 < (int)((ulong)(*(long *)(local_238 + 0x10) - lVar14) >> 3));
    }
    pTVar6 = local_1c8;
    this_00 = &this->builder;
    iVar8 = (**(local_1c8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
               _vptr_TIntermNode)(local_1c8);
    iVar8 = *(int *)(CONCAT44(extraout_var_02,iVar8) + 0xc);
    iVar9 = (**(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
               _vptr_TIntermNode)(pTVar6);
    lVar22 = local_238;
    lVar14 = local_248;
    if (*(long *)CONCAT44(extraout_var_03,iVar9) == 0) {
      filename = (char *)0x0;
    }
    else {
      filename = *(char **)(*(long *)CONCAT44(extraout_var_03,iVar9) + 8);
    }
    spv::Builder::setDebugSourceLocation(this_00,iVar8,filename);
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (uint *)0x0;
    local_198._16_8_ = (uint *)0x0;
    function = local_240;
    if (0 < (int)((ulong)(*(long *)(lVar22 + 0x10) - *(long *)(lVar22 + 8)) >> 3)) {
      p_Var21 = &(local_240->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1f8 = &(this->builder).accessChain.indexChain;
      local_200 = &(this->builder).accessChain.swizzle;
      local_208 = &(this->builder).accessChain.component;
      lVar20 = 0;
      local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ((ulong)local_250 & 0xffffffff00000000);
      local_254 = 0;
      local_230 = p_Var21;
      do {
        bVar7 = originalParam(this,*(TStorageQualifier *)(*(long *)(lVar14 + 8) + lVar20 * 4),
                              *(TType **)((long)local_228 + lVar20 * 8),
                              (bool)(lVar20 == 0 & function->implicitThis));
        pAVar4 = local_1b8.
                 super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (bVar7) {
          lVar14 = (long)(int)local_250;
          pAVar2 = local_1b8.
                   super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar14;
          local_88 = pAVar2->base;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_80,&pAVar2->indexChain);
          local_68 = pAVar2->instr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_60,&pAVar4[lVar14].swizzle);
          local_38 = *(undefined2 *)&pAVar4[lVar14].coherentFlags;
          local_48._0_4_ = pAVar4[lVar14].component;
          local_48._4_4_ = pAVar4[lVar14].preSwizzleBaseType;
          pAVar4 = pAVar4 + lVar14;
          uStack_40._0_1_ = pAVar4->isRValue;
          uStack_40._1_3_ = *(undefined3 *)&pAVar4->field_0x49;
          uStack_40._4_4_ = pAVar4->alignment;
          (this->builder).accessChain.base = local_88;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_1f8,&local_80);
          (this->builder).accessChain.instr = local_68;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_200,&local_60);
          *(undefined2 *)(local_208 + 4) = local_38;
          *(undefined8 *)local_208 = local_48;
          *(undefined8 *)(local_208 + 2) = uStack_40;
          if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_258 = spv::Builder::accessChainGetLValue(this_00);
          local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(local_250._4_4_,(int)local_250 + 1);
          p_Var21 = local_230;
          lVar14 = local_248;
          function = local_240;
          lVar22 = local_238;
        }
        else {
          iVar8 = *(int *)(*(long *)(lVar14 + 8) + lVar20 * 4);
          if (iVar8 - 0x10U < 3) {
            p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_parent;
            p_Var17 = p_Var21;
            p_Var19 = p_Var21;
            if (p_Var16 != (_Base_ptr)0x0) {
              do {
                if (lVar20 <= (int)p_Var16[1]._M_color) {
                  p_Var17 = p_Var16;
                }
                p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar20];
              } while (p_Var16 != (_Base_ptr)0x0);
              if ((p_Var17 != p_Var21) && (p_Var19 = p_Var17, lVar20 < (int)p_Var17[1]._M_color)) {
                p_Var19 = p_Var21;
              }
            }
            DVar11 = DecorationRelaxedPrecision;
            if (p_Var19 == p_Var21) {
              DVar11 = DecorationMax;
            }
            IVar10 = spv::Builder::getContainedTypeId
                               (this_00,(local_240->parameterInstructions).
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar20]->typeId);
            local_258 = spv::Builder::createVariable(this_00,DVar11,Function,IVar10,"param",0,true);
            pAVar4 = local_1b8.
                     super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((*(uint *)(*(long *)(lVar14 + 8) + lVar20 * 4) | 2) == 0x12) {
              lVar14 = (long)(int)local_250;
              pAVar2 = local_1b8.
                       super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar14;
              local_e0 = pAVar2->base;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_d8,&pAVar2->indexChain);
              local_c0 = pAVar2->instr;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_b8,&pAVar4[lVar14].swizzle);
              local_90 = *(undefined2 *)&pAVar4[lVar14].coherentFlags;
              local_a0._0_4_ = pAVar4[lVar14].component;
              local_a0._4_4_ = pAVar4[lVar14].preSwizzleBaseType;
              pAVar4 = pAVar4 + lVar14;
              uStack_98._0_1_ = pAVar4->isRValue;
              uStack_98._1_3_ = *(undefined3 *)&pAVar4->field_0x49;
              uStack_98._4_4_ = pAVar4->alignment;
              (this->builder).accessChain.base = local_e0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_1f8,&local_d8);
              (this->builder).accessChain.instr = local_c0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_200,&local_b8);
              *(undefined2 *)(local_208 + 4) = local_90;
              *(undefined8 *)local_208 = local_a0;
              *(undefined8 *)(local_208 + 2) = uStack_98;
              if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_b8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_b8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              IVar10 = accessChainLoad(this,*(TType **)((long)local_228 + lVar20 * 8));
              spv::Builder::clearAccessChain(this_00);
              spv::Builder::setAccessChainLValue(this_00,local_258);
              multiTypeStore(this,*(TType **)((long)local_228 + lVar20 * 8),IVar10);
              lVar14 = local_248;
              lVar22 = local_238;
            }
            local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(local_250._4_4_,(int)local_250 + 1);
            p_Var21 = local_230;
            function = local_240;
          }
          else {
            if ((iVar8 != 5) && (iVar8 != 0x13)) goto LAB_0044adb8;
            local_1c0 = (long)(int)local_254;
            pIVar3 = (this->builder).module.idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_1c0]];
            if (pIVar3 == (Instruction *)0x0) {
              IVar10 = 0;
            }
            else {
              IVar10 = pIVar3->typeId;
            }
            if ((function->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar20]->typeId == IVar10) {
              lVar15 = (**(code **)(**(long **)((long)local_228 + lVar20 * 8) + 0x58))();
              uVar18 = (*(uint *)(lVar15 + 8) >> 0x19 & 7) - 1;
              p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_parent;
              p_Var17 = p_Var21;
              p_Var19 = p_Var16;
              if (p_Var16 == (_Base_ptr)0x0) {
LAB_0044a984:
                if (uVar18 < 2) goto LAB_0044a98d;
              }
              else {
                do {
                  p_Var1 = p_Var19 + 1;
                  if (lVar20 <= (int)p_Var1->_M_color) {
                    p_Var17 = p_Var19;
                  }
                  pp_Var5 = &p_Var19->_M_left;
                  p_Var19 = pp_Var5[(int)p_Var1->_M_color < lVar20];
                } while (pp_Var5[(int)p_Var1->_M_color < lVar20] != (_Base_ptr)0x0);
                if (p_Var17 == p_Var21) goto LAB_0044a984;
                if (lVar20 < (int)p_Var17[1]._M_color == uVar18 < 2) goto LAB_0044a98d;
              }
              local_258 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_1c0];
            }
            else {
              p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_parent;
LAB_0044a98d:
              p_Var17 = p_Var21;
              p_Var19 = p_Var21;
              if (p_Var16 != (_Base_ptr)0x0) {
                do {
                  if (lVar20 <= (int)p_Var16[1]._M_color) {
                    p_Var17 = p_Var16;
                  }
                  p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar20];
                } while (p_Var16 != (_Base_ptr)0x0);
                if ((p_Var17 != p_Var21) && (p_Var19 = p_Var17, lVar20 < (int)p_Var17[1]._M_color))
                {
                  p_Var19 = p_Var21;
                }
              }
              DVar11 = DecorationRelaxedPrecision;
              if (p_Var19 == p_Var21) {
                DVar11 = DecorationMax;
              }
              IVar10 = spv::Builder::createVariable
                                 (this_00,DVar11,Function,
                                  (function->parameterInstructions).
                                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar20]->typeId,"arg",0,
                                  true);
              spv::Builder::clearAccessChain(this_00);
              p_Var21 = local_230;
              local_1ec = IVar10;
              spv::Builder::setAccessChainLValue(this_00,IVar10);
              multiTypeStore(this,*(TType **)((long)local_228 + lVar20 * 8),
                             local_1e8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[local_1c0]);
              lVar14 = local_248;
              p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_parent;
              p_Var17 = p_Var21;
              p_Var19 = p_Var21;
              if (p_Var16 != (_Base_ptr)0x0) {
                do {
                  if (lVar20 <= (int)p_Var16[1]._M_color) {
                    p_Var17 = p_Var16;
                  }
                  p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar20];
                } while (p_Var16 != (_Base_ptr)0x0);
                if ((p_Var17 != p_Var21) && (p_Var19 = p_Var17, lVar20 < (int)p_Var17[1]._M_color))
                {
                  p_Var19 = p_Var21;
                }
              }
              DVar11 = DecorationRelaxedPrecision;
              if (p_Var19 == p_Var21) {
                DVar11 = DecorationMax;
              }
              local_258 = spv::Builder::createLoad(this_00,local_1ec,DVar11,MaskNone,Max,0);
              function = local_240;
            }
            local_254 = local_254 + 1;
          }
        }
        if (local_198._8_8_ == local_198._16_8_) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_198,
                     (iterator)local_198._8_8_,&local_258);
        }
        else {
          *(Id *)local_198._8_8_ = local_258;
          local_198._8_8_ = local_198._8_8_ + 4;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)(*(long *)(lVar22 + 0x10) - *(long *)(lVar22 + 8)) >> 3));
    }
    IVar10 = spv::Builder::createFunctionCall
                       (this_00,function,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
    pTVar6 = local_1c8;
    iVar8 = (*(local_1c8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1e])(local_1c8);
    lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_04,iVar8));
    if ((IVar10 != 0) && ((*(uint *)(lVar20 + 8) >> 0x19 & 7) - 1 < 2)) {
      spv::Builder::addDecoration(this_00,IVar10,DecorationRelaxedPrecision,-1);
    }
    iVar8 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1e])(pTVar6);
    lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x58))
                       ((long *)CONCAT44(extraout_var_05,iVar8));
    DVar11 = TranslateNonUniformDecoration(this,*(TQualifier **)(lVar20 + 8));
    local_254 = IVar10;
    spv::Builder::addDecoration(this_00,IVar10,DVar11,-1);
    if (0 < (int)((ulong)(*(long *)(lVar22 + 0x10) - *(long *)(lVar22 + 8)) >> 3)) {
      local_1f8 = &(this->builder).accessChain.indexChain;
      local_200 = &(this->builder).accessChain.swizzle;
      local_208 = &(this->builder).accessChain.component;
      lVar20 = 0;
      iVar8 = 0;
      do {
        bVar7 = originalParam(this,*(TStorageQualifier *)(*(long *)(lVar14 + 8) + lVar20 * 4),
                              *(TType **)((long)local_228 + lVar20 * 8),
                              (bool)(lVar20 == 0 & function->implicitThis));
        if (bVar7) {
LAB_0044ad94:
          iVar8 = iVar8 + 1;
        }
        else {
          iVar9 = *(int *)(*(long *)(lVar14 + 8) + lVar20 * 4);
          if (iVar9 < 0x11) {
            if (iVar9 != 5) {
              if (iVar9 == 0x10) goto LAB_0044ad94;
LAB_0044adb8:
              __assert_fail("qualifier == glslang::EvqIn || qualifier == glslang::EvqOut || qualifier == glslang::EvqInOut || qualifier == glslang::EvqUniform || qualifier == glslang::EvqConstReadOnly"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x1778,
                            "bool (anonymous namespace)::TGlslangToSpvTraverser::writableParam(glslang::TStorageQualifier) const"
                           );
            }
          }
          else {
            if (iVar9 - 0x11U < 2) {
              IVar10 = spv::Builder::createLoad
                                 (this_00,*(Id *)(local_198._0_8_ + lVar20 * 4),DecorationMax,
                                  MaskNone,Max,0);
              lVar14 = (**(code **)(**(long **)((long)local_228 + lVar20 * 8) + 0x58))();
              DVar11 = TranslateNonUniformDecoration(this,*(TQualifier **)(lVar14 + 8));
              local_230 = (_Base_ptr)CONCAT44(local_230._4_4_,IVar10);
              spv::Builder::addDecoration(this_00,IVar10,DVar11,-1);
              pAVar2 = local_1b8.
                       super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(local_250._4_4_,iVar8);
              pAVar4 = local_1b8.
                       super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar8;
              local_138 = pAVar4->base;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_130,&pAVar4->indexChain);
              local_118 = pAVar4->instr;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_110,&pAVar2[iVar8].swizzle);
              local_e8 = *(undefined2 *)&pAVar2[iVar8].coherentFlags;
              local_f8._0_4_ = pAVar2[iVar8].component;
              local_f8._4_4_ = pAVar2[iVar8].preSwizzleBaseType;
              pAVar2 = pAVar2 + iVar8;
              uStack_f0._0_1_ = pAVar2->isRValue;
              uStack_f0._1_3_ = *(undefined3 *)&pAVar2->field_0x49;
              uStack_f0._4_4_ = pAVar2->alignment;
              (this->builder).accessChain.base = local_138;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_1f8,&local_130);
              (this->builder).accessChain.instr = local_118;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_200,&local_110);
              *(undefined2 *)(local_208 + 4) = local_e8;
              *(undefined8 *)local_208 = local_f8;
              *(undefined8 *)(local_208 + 2) = uStack_f0;
              if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_110.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_110.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar22 = local_238;
              function = local_240;
              if (local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_130.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_130.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_130.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              multiTypeStore(this,*(TType **)((long)local_228 + lVar20 * 8),(Id)local_230);
              lVar14 = local_248;
              iVar8 = (int)local_250;
              goto LAB_0044ad94;
            }
            if (iVar9 != 0x13) goto LAB_0044adb8;
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)(*(long *)(lVar22 + 0x10) - *(long *)(lVar22 + 8)) >> 3));
    }
    if ((pointer)local_198._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
    }
    if (local_228 != (void *)0x0) {
      operator_delete(local_228,local_218 - (long)local_228);
    }
    IVar10 = local_254;
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::~vector
              (&local_1b8);
  }
  return IVar10;
}

Assistant:

spv::Id TGlslangToSpvTraverser::handleUserFunctionCall(const glslang::TIntermAggregate* node)
{
    // Grab the function's pointer from the previously created function
    spv::Function* function = functionMap[node->getName().c_str()];
    if (! function)
        return 0;

    const glslang::TIntermSequence& glslangArgs = node->getSequence();
    const glslang::TQualifierList& qualifiers = node->getQualifierList();

    //  See comments in makeFunctions() for details about the semantics for parameter passing.
    //
    // These imply we need a four step process:
    // 1. Evaluate the arguments
    // 2. Allocate and make copies of in, out, and inout arguments
    // 3. Make the call
    // 4. Copy back the results

    // 1. Evaluate the arguments and their types
    std::vector<spv::Builder::AccessChain> lValues;
    std::vector<spv::Id> rValues;
    std::vector<const glslang::TType*> argTypes;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        argTypes.push_back(&glslangArgs[a]->getAsTyped()->getType());
        // build l-value
        builder.clearAccessChain();
        glslangArgs[a]->traverse(this);
        // keep outputs and pass-by-originals as l-values, evaluate others as r-values
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0) ||
            writableParam(qualifiers[a])) {
            // save l-value
            lValues.push_back(builder.getAccessChain());
        } else {
            // process r-value
            rValues.push_back(accessChainLoad(*argTypes.back()));
        }
    }

    // Reset source location to the function call location after argument evaluation
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    // 2. Allocate space for anything needing a copy, and if it's "in" or "inout"
    // copy the original into that space.
    //
    // Also, build up the list of actual arguments to pass in for the call
    int lValueCount = 0;
    int rValueCount = 0;
    std::vector<spv::Id> spvArgs;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        spv::Id arg;
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0)) {
            builder.setAccessChain(lValues[lValueCount]);
            arg = builder.accessChainGetLValue();
            ++lValueCount;
        } else if (writableParam(qualifiers[a])) {
            // need space to hold the copy
            arg = builder.createVariable(function->getParamPrecision(a), spv::StorageClassFunction,
                builder.getContainedTypeId(function->getParamType(a)), "param");
            if (qualifiers[a] == glslang::EvqIn || qualifiers[a] == glslang::EvqInOut) {
                // need to copy the input into output space
                builder.setAccessChain(lValues[lValueCount]);
                spv::Id copy = accessChainLoad(*argTypes[a]);
                builder.clearAccessChain();
                builder.setAccessChainLValue(arg);
                multiTypeStore(*argTypes[a], copy);
            }
            ++lValueCount;
        } else {
            // process r-value, which involves a copy for a type mismatch
            if (function->getParamType(a) != builder.getTypeId(rValues[rValueCount]) ||
                TranslatePrecisionDecoration(*argTypes[a]) != function->getParamPrecision(a))
            {
                spv::Id argCopy = builder.createVariable(function->getParamPrecision(a), spv::StorageClassFunction, function->getParamType(a), "arg");
                builder.clearAccessChain();
                builder.setAccessChainLValue(argCopy);
                multiTypeStore(*argTypes[a], rValues[rValueCount]);
                arg = builder.createLoad(argCopy, function->getParamPrecision(a));
            } else
                arg = rValues[rValueCount];
            ++rValueCount;
        }
        spvArgs.push_back(arg);
    }

    // 3. Make the call.
    spv::Id result = builder.createFunctionCall(function, spvArgs);
    builder.setPrecision(result, TranslatePrecisionDecoration(node->getType()));
    builder.addDecoration(result, TranslateNonUniformDecoration(node->getType().getQualifier()));

    // 4. Copy back out an "out" arguments.
    lValueCount = 0;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0))
            ++lValueCount;
        else if (writableParam(qualifiers[a])) {
            if (qualifiers[a] == glslang::EvqOut || qualifiers[a] == glslang::EvqInOut) {
                spv::Id copy = builder.createLoad(spvArgs[a], spv::NoPrecision);
                builder.addDecoration(copy, TranslateNonUniformDecoration(argTypes[a]->getQualifier()));
                builder.setAccessChain(lValues[lValueCount]);
                multiTypeStore(*argTypes[a], copy);
            }
            ++lValueCount;
        }
    }

    return result;
}